

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void drop_prog_elven_gem(OBJ_DATA *obj,CHAR_DATA *ch)

{
  void *in_RSI;
  CHAR_DATA *in_RDI;
  OBJ_DATA *obj2;
  void *arg2;
  
  arg2 = *(void **)(*(long *)((long)in_RSI + 0xa8) + 0x20);
  while( true ) {
    if (arg2 == (void *)0x0) {
      return;
    }
    if (*(short *)(in_RDI->last_fight_name + 0x50) ==
        *(short *)(*(long *)((long)arg2 + 0x50) + 0x50)) break;
    arg2 = *(void **)((long)arg2 + 8);
  }
  act((char *)obj2,in_RDI,in_RSI,arg2,0);
  extract_obj(obj);
  return;
}

Assistant:

void drop_prog_elven_gem(OBJ_DATA *obj, CHAR_DATA *ch)
{
	OBJ_DATA *obj2;

	for (obj2 = ch->in_room->contents; obj2 != nullptr; obj2 = obj2->next_content)
	{
		if (obj->pIndexData->vnum == obj2->pIndexData->vnum)
		{
			act("As $p falls to the floor, it disintegrates and becomes a cloud of dust.", ch, obj, 0, TO_ROOM);
			extract_obj(obj);
			break;
		}
	}
}